

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-softmaxes.cc
# Opt level: O0

void __thiscall
dynet::SparsemaxLoss::backward_dev_impl<dynet::Device_CPU>
          (SparsemaxLoss *this,Device_CPU *dev,
          vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_> *xs,Tensor *fx,
          Tensor *dEdf,uint i,Tensor *dEdxi)

{
  float fVar1;
  size_type sVar2;
  const_reference ppTVar3;
  Scalar *pSVar4;
  ulong uVar5;
  vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_> *in_RDX;
  Tensor *in_RDI;
  long in_R8;
  uint i_1;
  Tensor *in_stack_00000088;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> sm;
  Tensor tsm;
  float dqprop;
  float *psm;
  float d;
  DeviceMempool in_stack_fffffffffffffea4;
  float fVar6;
  Device *in_stack_fffffffffffffea8;
  value_type v;
  Dim *d_00;
  float local_12c;
  float *in_stack_fffffffffffffee0;
  MatrixBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_fffffffffffffee8;
  uint local_104;
  
  fVar1 = **(float **)(in_R8 + 0x28);
  d_00 = *(Dim **)(in_RDI[1].d.d + 6);
  sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)&in_RDI[1].mem_pool);
  local_12c = (float)sVar2;
  ppTVar3 = std::vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>::operator[]
                      (in_RDX,0);
  v = *ppTVar3;
  std::vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>::operator[](in_RDX,0);
  Tensor::Tensor(in_RDI,d_00,(float *)v,in_stack_fffffffffffffea8,in_stack_fffffffffffffea4);
  Tensor::operator*(in_stack_00000088);
  Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>>::operator*
            (in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
  Tensor::operator*(in_stack_00000088);
  Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>>::operator+=
            ((MatrixBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
              *)in_RDI,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>_>_>
              *)d_00);
  local_104 = 0;
  while( true ) {
    uVar5 = (ulong)local_104;
    sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)&in_RDI[1].mem_pool)
    ;
    if (sVar2 <= uVar5) break;
    fVar6 = fVar1 / local_12c;
    Tensor::operator*(in_stack_00000088);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)&in_RDI[1].mem_pool,
               (ulong)local_104);
    pSVar4 = Eigen::
             DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_1>
             ::operator()((DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                           *)in_RDI,(Index)d_00,(Index)v);
    *pSVar4 = *pSVar4 - fVar6;
    local_104 = local_104 + 1;
  }
  return;
}

Assistant:

void SparsemaxLoss::backward_dev_impl(const MyDevice & dev,
                             const vector<const Tensor*>& xs,
                             const Tensor& fx,
                             const Tensor& dEdf,
                             unsigned i,
                             Tensor& dEdxi) const {
#ifdef __CUDACC__
  DYNET_NO_CUDA_IMPL_ERROR("SparsemaxLoss backward");
#else
  const float d = dEdf.v[0];
  float* psm = static_cast<float*>(aux_mem);
  float dqprop = d / pq->size();
  Tensor tsm(xs[0]->d, psm, xs[0]->device, DeviceMempool::FXS);
  auto sm = *tsm;  // sparsemax(z)
  *dEdxi += sm * d;
  for (unsigned i = 0; i < pq->size(); ++i)
    (*dEdxi)((*pq)[i], 0) -= dqprop;
#endif
}